

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O2

void __thiscall ParserTestVariableScope::Run(ParserTestVariableScope *this)

{
  int iVar1;
  Test *pTVar2;
  bool bVar3;
  string sStack_48;
  
  iVar1 = g_current_test->assertion_failures_;
  ParserTest::AssertParse
            (&this->super_ParserTest,
             "foo = bar\nrule cmd\n  command = cmd $foo $in $out\n\nbuild inner: cmd a\n  foo = baz\nbuild outer: cmd b\n\n"
            );
  if (iVar1 == g_current_test->assertion_failures_) {
    bVar3 = testing::Test::Check
                      (g_current_test,
                       (long)(this->super_ParserTest).state.edges_.
                             super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)(this->super_ParserTest).state.edges_.
                             super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                             super__Vector_impl_data._M_start == 0x10,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                       ,0xb7,"2u == state.edges_.size()");
    pTVar2 = g_current_test;
    if (bVar3) {
      Edge::EvaluateCommand_abi_cxx11_
                (&sStack_48,
                 *(this->super_ParserTest).state.edges_.
                  super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                  super__Vector_impl_data._M_start,false);
      bVar3 = std::operator==("cmd baz a inner",&sStack_48);
      testing::Test::Check
                (pTVar2,bVar3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0xb8,"\"cmd baz a inner\" == state.edges_[0]->EvaluateCommand()");
      std::__cxx11::string::~string((string *)&sStack_48);
      pTVar2 = g_current_test;
      Edge::EvaluateCommand_abi_cxx11_
                (&sStack_48,
                 (this->super_ParserTest).state.edges_.
                 super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.super__Vector_impl_data
                 ._M_start[1],false);
      bVar3 = std::operator==("cmd bar b outer",&sStack_48);
      testing::Test::Check
                (pTVar2,bVar3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0xb9,"\"cmd bar b outer\" == state.edges_[1]->EvaluateCommand()");
      std::__cxx11::string::~string((string *)&sStack_48);
    }
    else {
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    }
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(ParserTest, VariableScope) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"foo = bar\n"
"rule cmd\n"
"  command = cmd $foo $in $out\n"
"\n"
"build inner: cmd a\n"
"  foo = baz\n"
"build outer: cmd b\n"
"\n"  // Extra newline after build line tickles a regression.
));

  ASSERT_EQ(2u, state.edges_.size());
  EXPECT_EQ("cmd baz a inner", state.edges_[0]->EvaluateCommand());
  EXPECT_EQ("cmd bar b outer", state.edges_[1]->EvaluateCommand());
}